

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O2

void __thiscall
wasm::WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>::
run(WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
    *this,Module *module)

{
  PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_> *this_00;
  pointer puVar1;
  Global *pGVar2;
  pointer puVar3;
  Function *pFVar4;
  pointer puVar5;
  ElementSegment *pEVar6;
  undefined8 *puVar7;
  pointer puVar8;
  DataSegment *pDVar9;
  int iVar10;
  undefined8 *puVar11;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *curr_2;
  pointer puVar12;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *curr;
  pointer puVar13;
  pointer puVar14;
  pointer puVar15;
  PassOptions local_2b0;
  PassOptions local_1f8;
  Expression *local_140;
  PassRunner runner;
  _Head_base<0UL,_wasm::Pass_*,_false> local_38;
  
  if ((this->super_Pass).runner != (PassRunner *)0x0) {
    iVar10 = (*(this->super_Pass)._vptr_Pass[4])();
    if ((char)iVar10 == '\0') {
      this_00 = &this->
                 super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>;
      (this->super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>).
      super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.currModule =
           module;
      puVar1 = (module->globals).
               super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar13 = (module->globals).
                     super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar13 != puVar1;
          puVar13 = puVar13 + 1) {
        pGVar2 = (puVar13->_M_t).
                 super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                 super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
        if ((pGVar2->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
          Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::walk
                    (&this_00->
                      super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
                     &pGVar2->init);
        }
      }
      puVar3 = (module->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar14 = (module->functions).
                     super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar14 != puVar3;
          puVar14 = puVar14 + 1) {
        pFVar4 = (puVar14->_M_t).
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                 super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        if ((pFVar4->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
          (this->super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>).
          super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.currFunction =
               pFVar4;
          Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::walk
                    (&this_00->
                      super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
                     &pFVar4->body);
          (this->super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>).
          super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.currFunction =
               (Function *)0x0;
        }
      }
      puVar5 = (module->elementSegments).
               super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar12 = (module->elementSegments).
                     super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar12 != puVar5;
          puVar12 = puVar12 + 1) {
        pEVar6 = (puVar12->_M_t).
                 super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                 .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
        if (*(long *)(pEVar6 + 0x20) != 0) {
          Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::walk
                    (&this_00->
                      super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
                     (Expression **)(pEVar6 + 0x28));
        }
        puVar7 = *(undefined8 **)(pEVar6 + 0x40);
        for (puVar11 = *(undefined8 **)(pEVar6 + 0x38); puVar11 != puVar7; puVar11 = puVar11 + 1) {
          local_140 = (Expression *)*puVar11;
          Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::walk
                    (&this_00->
                      super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
                     &local_140);
        }
      }
      puVar8 = (module->dataSegments).
               super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar15 = (module->dataSegments).
                     super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar15 != puVar8;
          puVar15 = puVar15 + 1) {
        pDVar9 = (puVar15->_M_t).
                 super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                 .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
        if (pDVar9->isPassive == false) {
          Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::walk
                    (&this_00->
                      super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
                     &pDVar9->offset);
        }
      }
      (this->super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>).
      super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.currModule =
           (Module *)0x0;
    }
    else {
      PassOptions::PassOptions(&local_2b0,(PassOptions *)((this->super_Pass).runner + 0x30));
      local_2b0.optimizeLevel =
           ~-(uint)(local_2b0.optimizeLevel < 1) & 1 |
           local_2b0.optimizeLevel & -(uint)(local_2b0.optimizeLevel < 1);
      local_2b0.shrinkLevel =
           ~-(uint)(local_2b0.shrinkLevel < 1) & 1 |
           local_2b0.shrinkLevel & -(uint)(local_2b0.shrinkLevel < 1);
      PassOptions::PassOptions(&local_1f8,&local_2b0);
      PassRunner::PassRunner((PassRunner *)&local_140,module,&local_1f8);
      PassOptions::~PassOptions(&local_1f8);
      (*(this->super_Pass)._vptr_Pass[5])(&local_38,this);
      PassRunner::add((PassRunner *)&local_140,
                      (unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)&local_38);
      if (local_38._M_head_impl != (Pass *)0x0) {
        (*(local_38._M_head_impl)->_vptr_Pass[1])();
      }
      local_38._M_head_impl = (Pass *)0x0;
      wasm::PassRunner::run();
      PassRunner::~PassRunner((PassRunner *)&local_140);
      PassOptions::~PassOptions(&local_2b0);
    }
    return;
  }
  __assert_fail("getPassRunner()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/pass.h"
                ,0x203,
                "virtual void wasm::WalkerPass<wasm::PostWalker<NameMapper, wasm::UnifiedExpressionVisitor<NameMapper>>>::run(Module *) [WalkerType = wasm::PostWalker<NameMapper, wasm::UnifiedExpressionVisitor<NameMapper>>]"
               );
}

Assistant:

void run(Module* module) override {
    assert(getPassRunner());
    // Parallel pass running is implemented in the PassRunner.
    if (isFunctionParallel()) {
      // Reduce opt/shrink levels to a maximum of one in nested runners like
      // these, to balance runtime. We definitely want the full levels in the
      // main passes we run, but nested pass runners are of secondary
      // importance.
      // TODO Investigate the impact of allowing the levels to just pass
      //      through. That seems to cause at least some regression in compile
      //      times in -O3, however, but with careful measurement we may find
      //      the benefits are worth it. For now -O1 is a reasonable compromise
      //      as it has basically linear runtime, unlike -O2 and -O3.
      auto options = getPassOptions();
      options.optimizeLevel = std::min(options.optimizeLevel, 1);
      options.shrinkLevel = std::min(options.shrinkLevel, 1);
      PassRunner runner(module, options);
      runner.setIsNested(true);
      runner.add(create());
      runner.run();
      return;
    }
    // Single-thread running just calls the walkModule traversal.
    WalkerType::walkModule(module);
  }